

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,float *x,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w,MissingAction missing_action,double *x_sd,double *x_mean)

{
  size_t row;
  size_t *key;
  longdouble in_ST0;
  longdouble lVar1;
  longdouble lVar2;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar3;
  longdouble lVar4;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar5;
  longdouble local_a8;
  longdouble local_94;
  long local_88;
  ushort uStack_80;
  long local_78;
  ushort uStack_70;
  
  key = ix_arr + st;
  do {
    lVar1 = (longdouble)x[*key];
    if (NAN(x[*key])) {
      if (end < st) {
LAB_00262b5a:
        lVar1 = (longdouble)0;
        local_a8 = lVar1;
        local_94 = lVar1;
        for (; st <= end; st = st + 1) {
          lVar2 = (longdouble)x[*key];
          local_88 = SUB108(lVar2,0);
          uStack_80 = (ushort)((unkuint10)lVar2 >> 0x40);
          lVar2 = in_ST0;
          if ((!NAN(x[*key])) && ((~uStack_80 & 0x7fff) != 0 || local_88 != -0x8000000000000000)) {
            pVar5 = tsl::detail_robin_hash::
                    robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                    ::try_emplace<unsigned_long_const&>
                              ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                *)w,key);
            local_94 = local_94 +
                       (longdouble)*(double *)((pVar5.first.m_bucket.m_bucket)->m_value + 8);
            lVar3 = in_ST2;
            lVar4 = in_ST2;
            fmal();
            fmal();
            lVar1 = in_ST1;
            lVar2 = in_ST2;
            in_ST1 = lVar3;
            in_ST2 = lVar4;
            local_a8 = in_ST0;
          }
          key = key + 1;
          in_ST0 = lVar2;
        }
        *x_mean = (double)local_a8;
        *x_sd = (double)SQRT(lVar1 / local_94);
        return;
      }
    }
    else {
      local_78 = SUB108(lVar1,0);
      uStack_70 = (ushort)((unkuint10)lVar1 >> 0x40);
      if ((end < st) || ((~uStack_70 & 0x7fff) != 0 || local_78 != -0x8000000000000000))
      goto LAB_00262b5a;
    }
    st = st + 1;
    key = key + 1;
  } while( true );
}

Assistant:

void calc_mean_and_sd_weighted(size_t ix_arr[], size_t st, size_t end, real_t_ *restrict x, mapping &restrict w,
                               MissingAction missing_action, double &restrict x_sd, double &restrict x_mean)
{
    ldouble_safe cnt = 0;
    ldouble_safe w_this;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = x[ix_arr[st]];
    ldouble_safe xval;
    while (is_na_or_inf(m_prev) && st <= end)
    {
        m_prev = x[ix_arr[++st]];
    }

    for (size_t row = st; row <= end; row++)
    {
        xval = x[ix_arr[row]];
        if (likely(!is_na_or_inf(xval)))
        {
            w_this = w[ix_arr[row]];
            cnt += w_this;
            m = std::fma(w_this, (xval - m) / cnt, m);
            s = std::fma(w_this, (xval - m) * (xval - m_prev), s);
            m_prev = m;
        }
    }

    x_mean = m;
    x_sd   = std::sqrt((ldouble_safe)s / (ldouble_safe)cnt);
}